

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServerProtocol.cxx
# Opt level: O3

bool __thiscall
cmServerProtocol1::DoActivate(cmServerProtocol1 *this,cmServerRequest *request,string *errorMessage)

{
  cmake *this_00;
  cmState *state;
  bool bVar1;
  int iVar2;
  Value *pVVar3;
  long lVar4;
  long *plVar5;
  __normal_iterator<cmake::GeneratorInfo_*,_std::vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>_>
  _Var6;
  undefined8 *puVar7;
  GeneratorInfo *pGVar8;
  size_type *psVar9;
  __normal_iterator<cmake::GeneratorInfo_*,_std::vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>_>
  __last;
  undefined8 uVar10;
  _Alloc_hider _Var11;
  size_t __n;
  Value *this_01;
  long lVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  anon_class_16_2_b7cf16a7_for__M_pred __pred;
  string cachePath;
  string generator;
  string buildDirectory;
  string sourceDirectory;
  string extraGenerator;
  string platform;
  string toolset;
  vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_> generators;
  string local_300;
  string local_2e0;
  GeneratorInfo *local_2c0;
  GeneratorInfo *local_2b8;
  GeneratorInformation local_2b0;
  string local_1f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1d0;
  size_type local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1b0;
  size_type local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0;
  string local_190;
  string local_170;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_150;
  size_type local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_140;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_130;
  size_type local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_110;
  size_type local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_f0;
  size_type local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  string local_d0;
  string local_b0;
  string local_90;
  __normal_iterator<cmake::GeneratorInfo_*,_std::vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>_>
  local_70;
  vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this_01 = &request->Data;
  pVVar3 = Json::Value::operator[](this_01,&kSOURCE_DIRECTORY_KEY_abi_cxx11_);
  Json::Value::asString_abi_cxx11_(&local_170,pVVar3);
  pVVar3 = Json::Value::operator[](this_01,&kBUILD_DIRECTORY_KEY_abi_cxx11_);
  Json::Value::asString_abi_cxx11_(&local_190,pVVar3);
  pVVar3 = Json::Value::operator[](this_01,&kGENERATOR_KEY_abi_cxx11_);
  Json::Value::asString_abi_cxx11_(&local_1f0,pVVar3);
  pVVar3 = Json::Value::operator[](this_01,&kEXTRA_GENERATOR_KEY_abi_cxx11_);
  Json::Value::asString_abi_cxx11_(&local_d0,pVVar3);
  pVVar3 = Json::Value::operator[](this_01,&kTOOLSET_KEY_abi_cxx11_);
  Json::Value::asString_abi_cxx11_(&local_90,pVVar3);
  pVVar3 = Json::Value::operator[](this_01,&kPLATFORM_KEY_abi_cxx11_);
  Json::Value::asString_abi_cxx11_(&local_b0,pVVar3);
  if (local_170._M_string_length != 0) {
    cmsys::SystemTools::CollapseFullPath(&local_2b0.GeneratorName,&local_170);
    std::__cxx11::string::operator=((string *)&local_170,(string *)&local_2b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0.GeneratorName._M_dataplus._M_p != &local_2b0.GeneratorName.field_2) {
      operator_delete(local_2b0.GeneratorName._M_dataplus._M_p,
                      local_2b0.GeneratorName.field_2._M_allocated_capacity + 1);
    }
    cmsys::SystemTools::ConvertToUnixSlashes(&local_170);
  }
  if (local_190._M_string_length == 0) {
LAB_003a1ad8:
    local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e0,"\"","");
    plVar5 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_2e0,
                                (ulong)kBUILD_DIRECTORY_KEY_abi_cxx11_._M_dataplus._M_p);
    local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
    psVar9 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_300.field_2._M_allocated_capacity = *psVar9;
      local_300.field_2._8_8_ = plVar5[3];
    }
    else {
      local_300.field_2._M_allocated_capacity = *psVar9;
      local_300._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_300._M_string_length = plVar5[1];
    *plVar5 = (long)psVar9;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_300);
    paVar13 = &local_2b0.GeneratorName.field_2;
    psVar9 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_2b0.GeneratorName.field_2._M_allocated_capacity = *psVar9;
      local_2b0.GeneratorName.field_2._8_8_ = plVar5[3];
      local_2b0.GeneratorName._M_dataplus._M_p = (pointer)paVar13;
    }
    else {
      local_2b0.GeneratorName.field_2._M_allocated_capacity = *psVar9;
      local_2b0.GeneratorName._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_2b0.GeneratorName._M_string_length = plVar5[1];
    *plVar5 = (long)psVar9;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    if (errorMessage != (string *)0x0) {
      std::__cxx11::string::_M_assign((string *)errorMessage);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0.GeneratorName._M_dataplus._M_p != paVar13) {
LAB_003a1bcb:
      operator_delete(local_2b0.GeneratorName._M_dataplus._M_p,
                      local_2b0.GeneratorName.field_2._M_allocated_capacity + 1);
    }
LAB_003a1bd8:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_300._M_dataplus._M_p != &local_300.field_2) {
      operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
    }
    uVar10 = local_2e0.field_2._M_allocated_capacity;
    _Var11._M_p = local_2e0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
LAB_003a1bfe:
      operator_delete(_Var11._M_p,uVar10 + 1);
    }
  }
  else {
    cmsys::SystemTools::CollapseFullPath(&local_2b0.GeneratorName,&local_190);
    std::__cxx11::string::operator=((string *)&local_190,(string *)&local_2b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0.GeneratorName._M_dataplus._M_p != &local_2b0.GeneratorName.field_2) {
      operator_delete(local_2b0.GeneratorName._M_dataplus._M_p,
                      local_2b0.GeneratorName.field_2._M_allocated_capacity + 1);
    }
    cmsys::SystemTools::ConvertToUnixSlashes(&local_190);
    if (local_190._M_string_length == 0) goto LAB_003a1ad8;
    this_00 = (this->super_cmServerProtocol).m_CMakeInstance._M_t.
              super___uniq_ptr_impl<cmake,_std::default_delete<cmake>_>._M_t.
              super__Tuple_impl<0UL,_cmake_*,_std::default_delete<cmake>_>.
              super__Head_base<0UL,_cmake_*,_false>._M_head_impl;
    bVar1 = cmsys::SystemTools::PathExists(&local_190);
    if (!bVar1) {
LAB_003a18f7:
      if (local_170._M_string_length == 0) {
        local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e0,"\"","");
        puVar7 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_2e0,
                            (ulong)kSOURCE_DIRECTORY_KEY_abi_cxx11_._M_dataplus._M_p);
        local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
        psVar9 = puVar7 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar9) {
          local_300.field_2._M_allocated_capacity = *psVar9;
          local_300.field_2._8_8_ = puVar7[3];
        }
        else {
          local_300.field_2._M_allocated_capacity = *psVar9;
          local_300._M_dataplus._M_p = (pointer)*puVar7;
        }
        local_300._M_string_length = puVar7[1];
        *puVar7 = psVar9;
        puVar7[1] = 0;
        *(undefined1 *)(puVar7 + 2) = 0;
        puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_300);
        local_2b0.GeneratorName._M_dataplus._M_p = (pointer)&local_2b0.GeneratorName.field_2;
        psVar9 = puVar7 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar9) {
          local_2b0.GeneratorName.field_2._M_allocated_capacity = *psVar9;
          local_2b0.GeneratorName.field_2._8_8_ = puVar7[3];
        }
        else {
          local_2b0.GeneratorName.field_2._M_allocated_capacity = *psVar9;
          local_2b0.GeneratorName._M_dataplus._M_p = (pointer)*puVar7;
        }
        local_2b0.GeneratorName._M_string_length = puVar7[1];
        *puVar7 = psVar9;
        puVar7[1] = 0;
        *(undefined1 *)(puVar7 + 2) = 0;
        if (errorMessage != (string *)0x0) {
          std::__cxx11::string::_M_assign((string *)errorMessage);
        }
      }
      else {
        bVar1 = cmsys::SystemTools::FileIsDirectory(&local_170);
        if (bVar1) {
          if (local_1f0._M_string_length != 0) {
            local_68.super__Vector_base<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>
            ._M_impl.super__Vector_impl_data._M_start = (GeneratorInfo *)0x0;
            local_68.super__Vector_base<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>
            ._M_impl.super__Vector_impl_data._M_finish = (GeneratorInfo *)0x0;
            local_68.super__Vector_base<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            cmake::GetRegisteredGenerators(this_00,&local_68,true);
            __n = local_1f0._M_string_length;
            _Var11._M_p = local_1f0._M_dataplus._M_p;
            lVar4 = (long)local_68.
                          super__Vector_base<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_68.
                          super__Vector_base<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start;
            lVar12 = (lVar4 >> 3) * -0x30c30c30c30c30c3 >> 2;
            local_70._M_current =
                 local_68.
                 super__Vector_base<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>.
                 _M_impl.super__Vector_impl_data._M_start;
            pGVar8 = local_68.
                     super__Vector_base<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            __last._M_current =
                 local_68.
                 super__Vector_base<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
            if (0 < lVar12) {
              local_2c0 = local_68.
                          super__Vector_base<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
              local_2b8 = local_68.
                          super__Vector_base<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start + lVar12 * 4;
              lVar12 = lVar12 + 1;
              pGVar8 = local_68.
                       super__Vector_base<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>
                       ._M_impl.super__Vector_impl_data._M_start + 2;
              do {
                if (__n == pGVar8[-2].name._M_string_length) {
                  if (__n == 0) {
                    __n = 0;
                  }
                  else {
                    iVar2 = bcmp(pGVar8[-2].name._M_dataplus._M_p,_Var11._M_p,__n);
                    if (iVar2 != 0) goto LAB_003a19ec;
                  }
                  __last._M_current = local_2c0;
                  pGVar8 = pGVar8 + -2;
                  goto LAB_003a21fa;
                }
LAB_003a19ec:
                if (__n == pGVar8[-1].name._M_string_length) {
                  if (__n == 0) {
                    pGVar8 = pGVar8 + -1;
LAB_003a21e4:
                    __last._M_current = local_2c0;
                    __n = 0;
                  }
                  else {
                    iVar2 = bcmp(pGVar8[-1].name._M_dataplus._M_p,_Var11._M_p,__n);
                    if (iVar2 != 0) goto LAB_003a1a1a;
                    __last._M_current = local_2c0;
                    pGVar8 = pGVar8 + -1;
                  }
                  goto LAB_003a21fa;
                }
LAB_003a1a1a:
                if (__n == (pGVar8->name)._M_string_length) {
                  if (__n == 0) goto LAB_003a21e4;
                  iVar2 = bcmp((pGVar8->name)._M_dataplus._M_p,_Var11._M_p,__n);
                  __last._M_current = local_2c0;
                  if (iVar2 == 0) goto LAB_003a21fa;
                }
                if (__n == pGVar8[1].name._M_string_length) {
                  if (__n == 0) {
                    pGVar8 = pGVar8 + 1;
                    goto LAB_003a21e4;
                  }
                  iVar2 = bcmp(pGVar8[1].name._M_dataplus._M_p,_Var11._M_p,__n);
                  if (iVar2 == 0) {
                    __last._M_current = local_2c0;
                    pGVar8 = pGVar8 + 1;
                    goto LAB_003a21fa;
                  }
                }
                lVar12 = lVar12 + -1;
                pGVar8 = pGVar8 + 4;
              } while (1 < lVar12);
              lVar4 = (long)local_2c0 - (long)local_2b8;
              pGVar8 = local_2b8;
              __last._M_current = local_2c0;
            }
            lVar4 = (lVar4 >> 3) * -0x30c30c30c30c30c3;
            if (lVar4 == 3) {
              __n = (pGVar8->name)._M_string_length;
              local_2c0 = __last._M_current;
              if (local_1f0._M_string_length != __n) {
LAB_003a2140:
                pGVar8 = pGVar8 + 1;
                __last._M_current = local_2c0;
                goto LAB_003a214c;
              }
              if (__n == 0) {
                __n = 0;
              }
              else {
                local_2b8 = pGVar8;
                iVar2 = bcmp((pGVar8->name)._M_dataplus._M_p,local_1f0._M_dataplus._M_p,__n);
                pGVar8 = local_2b8;
                __last._M_current = local_2c0;
                if (iVar2 != 0) goto LAB_003a2140;
              }
              goto LAB_003a21fa;
            }
            if (lVar4 == 2) {
LAB_003a214c:
              if (local_1f0._M_string_length != (pGVar8->name)._M_string_length) {
LAB_003a2183:
                pGVar8 = pGVar8 + 1;
                goto LAB_003a218d;
              }
              if (local_1f0._M_string_length == 0) {
                __n = 0;
              }
              else {
                local_2b8 = pGVar8;
                iVar2 = bcmp((pGVar8->name)._M_dataplus._M_p,local_1f0._M_dataplus._M_p,
                             local_1f0._M_string_length);
                pGVar8 = local_2b8;
                __n = local_1f0._M_string_length;
                if (iVar2 != 0) goto LAB_003a2183;
              }
              goto LAB_003a21fa;
            }
            if (lVar4 == 1) {
LAB_003a218d:
              if (local_1f0._M_string_length != (pGVar8->name)._M_string_length) goto LAB_003a2277;
              if (local_1f0._M_string_length == 0) {
                __n = 0;
              }
              else {
                iVar2 = bcmp((pGVar8->name)._M_dataplus._M_p,local_1f0._M_dataplus._M_p,
                             local_1f0._M_string_length);
                __n = local_1f0._M_string_length;
                if (iVar2 != 0) goto LAB_003a2277;
              }
LAB_003a21fa:
              paVar13 = &local_2b0.GeneratorName.field_2;
              if (pGVar8 == __last._M_current) goto LAB_003a2277;
              __pred.extraGenerator = &local_d0;
              __pred.generator = &local_1f0;
              _Var6 = std::
                      find_if<__gnu_cxx::__normal_iterator<cmake::GeneratorInfo*,std::vector<cmake::GeneratorInfo,std::allocator<cmake::GeneratorInfo>>>,cmServerProtocol1::DoActivate(cmServerRequest_const&,std::__cxx11::string*)::__1>
                                (local_70,__last,__pred);
              local_2b0.GeneratorName._M_dataplus._M_p = (pointer)paVar13;
              if (_Var6._M_current == __last._M_current) {
                std::operator+(&local_50,"The combination of generator \"",&local_1f0);
                puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_50);
                psVar9 = puVar7 + 2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar7 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar9) {
                  local_2e0.field_2._M_allocated_capacity = *psVar9;
                  local_2e0.field_2._8_8_ = puVar7[3];
                  local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
                }
                else {
                  local_2e0.field_2._M_allocated_capacity = *psVar9;
                  local_2e0._M_dataplus._M_p = (pointer)*puVar7;
                }
                local_2e0._M_string_length = puVar7[1];
                *puVar7 = psVar9;
                puVar7[1] = 0;
                *(undefined1 *)(puVar7 + 2) = 0;
                std::operator+(&local_300,&local_2e0,&local_d0);
                puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_300);
                psVar9 = puVar7 + 2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar7 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar9) {
                  local_2b0.GeneratorName.field_2._M_allocated_capacity = *psVar9;
                  local_2b0.GeneratorName.field_2._8_8_ = puVar7[3];
                }
                else {
                  local_2b0.GeneratorName.field_2._M_allocated_capacity = *psVar9;
                  local_2b0.GeneratorName._M_dataplus._M_p = (pointer)*puVar7;
                }
                local_2b0.GeneratorName._M_string_length = puVar7[1];
                *puVar7 = psVar9;
                puVar7[1] = 0;
                *(undefined1 *)(puVar7 + 2) = 0;
                if (errorMessage != (string *)0x0) {
                  std::__cxx11::string::_M_assign((string *)errorMessage);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_2b0.GeneratorName._M_dataplus._M_p != paVar13) {
                  operator_delete(local_2b0.GeneratorName._M_dataplus._M_p,
                                  local_2b0.GeneratorName.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_300._M_dataplus._M_p != &local_300.field_2) {
                  operator_delete(local_300._M_dataplus._M_p,
                                  local_300.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
                  operator_delete(local_2e0._M_dataplus._M_p,
                                  local_2e0.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_50._M_dataplus._M_p == &local_50.field_2) goto LAB_003a2654;
                goto LAB_003a264c;
              }
              if (((_Var6._M_current)->supportsToolset == false) && (local_90._M_string_length != 0)
                 ) {
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_2b0,
                           "Toolset was provided but is not supported by the requested generator.",
                           "");
                if (errorMessage != (string *)0x0) {
                  std::__cxx11::string::_M_assign((string *)errorMessage);
                }
LAB_003a23fa:
                local_50.field_2._M_allocated_capacity =
                     local_2b0.GeneratorName.field_2._M_allocated_capacity;
                local_50._M_dataplus._M_p = local_2b0.GeneratorName._M_dataplus._M_p;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_2b0.GeneratorName._M_dataplus._M_p != paVar13) goto LAB_003a264c;
                goto LAB_003a2654;
              }
              if (((_Var6._M_current)->supportsPlatform == false) &&
                 (local_b0._M_string_length != 0)) {
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_2b0,
                           "Platform was provided but is not supported by the requested generator.",
                           "");
                if (errorMessage != (string *)0x0) {
                  std::__cxx11::string::_M_assign((string *)errorMessage);
                }
                goto LAB_003a23fa;
              }
              local_1b0 = &local_1a0;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_1b0,local_1f0._M_dataplus._M_p,
                         local_1f0._M_dataplus._M_p + __n);
              local_1d0 = &local_1c0;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_1d0,local_d0._M_dataplus._M_p,
                         local_d0._M_dataplus._M_p + local_d0._M_string_length);
              local_110 = &local_100;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_110,local_90._M_dataplus._M_p,
                         local_90._M_dataplus._M_p + local_90._M_string_length);
              local_130 = &local_120;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_130,local_b0._M_dataplus._M_p,
                         local_b0._M_dataplus._M_p + local_b0._M_string_length);
              local_150 = &local_140;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_150,local_170._M_dataplus._M_p,
                         local_170._M_dataplus._M_p + local_170._M_string_length);
              local_f0 = &local_e0;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_f0,local_190._M_dataplus._M_p,
                         local_190._M_dataplus._M_p + local_190._M_string_length);
              local_2b0.GeneratorName._M_dataplus._M_p = (pointer)&local_2b0.GeneratorName.field_2;
              if (local_1b0 == &local_1a0) {
                local_2b0.GeneratorName.field_2._8_8_ = local_1a0._8_8_;
              }
              else {
                local_2b0.GeneratorName._M_dataplus._M_p = (pointer)local_1b0;
              }
              local_2b0.GeneratorName.field_2._M_allocated_capacity._1_7_ =
                   local_1a0._M_allocated_capacity._1_7_;
              local_2b0.GeneratorName.field_2._M_local_buf[0] = local_1a0._M_local_buf[0];
              local_2b0.ExtraGeneratorName._M_dataplus._M_p =
                   (pointer)&local_2b0.ExtraGeneratorName.field_2;
              local_2b0.GeneratorName._M_string_length = local_1a8;
              local_1a8 = 0;
              local_1a0._M_local_buf[0] = '\0';
              if (local_1d0 == &local_1c0) {
                local_2b0.ExtraGeneratorName.field_2._8_8_ = local_1c0._8_8_;
              }
              else {
                local_2b0.ExtraGeneratorName._M_dataplus._M_p = (pointer)local_1d0;
              }
              local_2b0.Toolset._M_dataplus._M_p = (pointer)&local_2b0.Toolset.field_2;
              local_2b0.ExtraGeneratorName._M_string_length = local_1c8;
              local_1c8 = 0;
              local_1c0._M_local_buf[0] = '\0';
              if (local_110 == &local_100) {
                local_2b0.Toolset.field_2._8_8_ = local_100._8_8_;
              }
              else {
                local_2b0.Toolset._M_dataplus._M_p = (pointer)local_110;
              }
              local_2b0.Platform._M_dataplus._M_p = (pointer)&local_2b0.Platform.field_2;
              local_2b0.Toolset._M_string_length = local_108;
              local_108 = 0;
              local_100._M_local_buf[0] = '\0';
              if (local_130 == &local_120) {
                local_2b0.Platform.field_2._8_8_ = local_120._8_8_;
              }
              else {
                local_2b0.Platform._M_dataplus._M_p = (pointer)local_130;
              }
              local_2b0.SourceDirectory._M_dataplus._M_p =
                   (pointer)&local_2b0.SourceDirectory.field_2;
              local_2b0.Platform._M_string_length = local_128;
              local_128 = 0;
              local_120._M_local_buf[0] = '\0';
              if (local_150 == &local_140) {
                local_2b0.SourceDirectory.field_2._8_8_ = local_140._8_8_;
              }
              else {
                local_2b0.SourceDirectory._M_dataplus._M_p = (pointer)local_150;
              }
              local_2b0.BuildDirectory._M_dataplus._M_p = (pointer)&local_2b0.BuildDirectory.field_2
              ;
              local_2b0.SourceDirectory._M_string_length = local_148;
              local_148 = 0;
              local_140._M_local_buf[0] = '\0';
              if (local_f0 == &local_e0) {
                local_2b0.BuildDirectory.field_2._8_8_ = local_e0._8_8_;
              }
              else {
                local_2b0.BuildDirectory._M_dataplus._M_p = (pointer)local_f0;
              }
              local_2b0.BuildDirectory._M_string_length = local_e8;
              local_e8 = 0;
              local_e0._M_local_buf[0] = '\0';
              local_1d0 = &local_1c0;
              local_1b0 = &local_1a0;
              local_150 = &local_140;
              local_130 = &local_120;
              local_110 = &local_100;
              local_f0 = &local_e0;
              GeneratorInformation::operator=(&this->GeneratorInfo,&local_2b0);
              GeneratorInformation::~GeneratorInformation(&local_2b0);
              if (local_f0 != &local_e0) {
                operator_delete(local_f0,CONCAT71(local_e0._M_allocated_capacity._1_7_,
                                                  local_e0._M_local_buf[0]) + 1);
              }
              if (local_150 != &local_140) {
                operator_delete(local_150,
                                CONCAT71(local_140._M_allocated_capacity._1_7_,
                                         local_140._M_local_buf[0]) + 1);
              }
              if (local_130 != &local_120) {
                operator_delete(local_130,
                                CONCAT71(local_120._M_allocated_capacity._1_7_,
                                         local_120._M_local_buf[0]) + 1);
              }
              if (local_110 != &local_100) {
                operator_delete(local_110,
                                CONCAT71(local_100._M_allocated_capacity._1_7_,
                                         local_100._M_local_buf[0]) + 1);
              }
              if (local_1d0 != &local_1c0) {
                operator_delete(local_1d0,
                                CONCAT71(local_1c0._M_allocated_capacity._1_7_,
                                         local_1c0._M_local_buf[0]) + 1);
              }
              if (local_1b0 != &local_1a0) {
                operator_delete(local_1b0,
                                CONCAT71(local_1a0._M_allocated_capacity._1_7_,
                                         local_1a0._M_local_buf[0]) + 1);
              }
              this->m_State = STATE_ACTIVE;
              bVar1 = true;
            }
            else {
LAB_003a2277:
              paVar13 = &local_2b0.GeneratorName.field_2;
              local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_2e0,"Generator \"","");
              std::operator+(&local_300,&local_2e0,&local_1f0);
              puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_300);
              psVar9 = puVar7 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar7 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar9) {
                local_2b0.GeneratorName.field_2._M_allocated_capacity = *psVar9;
                local_2b0.GeneratorName.field_2._8_8_ = puVar7[3];
                local_2b0.GeneratorName._M_dataplus._M_p = (pointer)paVar13;
              }
              else {
                local_2b0.GeneratorName.field_2._M_allocated_capacity = *psVar9;
                local_2b0.GeneratorName._M_dataplus._M_p = (pointer)*puVar7;
              }
              local_2b0.GeneratorName._M_string_length = puVar7[1];
              *puVar7 = psVar9;
              puVar7[1] = 0;
              *(undefined1 *)(puVar7 + 2) = 0;
              if (errorMessage != (string *)0x0) {
                std::__cxx11::string::_M_assign((string *)errorMessage);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2b0.GeneratorName._M_dataplus._M_p != paVar13) {
                operator_delete(local_2b0.GeneratorName._M_dataplus._M_p,
                                local_2b0.GeneratorName.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_300._M_dataplus._M_p != &local_300.field_2) {
                operator_delete(local_300._M_dataplus._M_p,
                                local_300.field_2._M_allocated_capacity + 1);
              }
              local_50.field_2._M_allocated_capacity = local_2e0.field_2._M_allocated_capacity;
              local_50._M_dataplus._M_p = local_2e0._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
LAB_003a264c:
                operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1
                               );
              }
LAB_003a2654:
              bVar1 = false;
            }
            std::vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>::~vector
                      (&local_68);
            goto LAB_003a1c08;
          }
          local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e0,"\"","");
          puVar7 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_2e0,(ulong)kGENERATOR_KEY_abi_cxx11_._M_dataplus._M_p);
          local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
          psVar9 = puVar7 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar7 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar9) {
            local_300.field_2._M_allocated_capacity = *psVar9;
            local_300.field_2._8_8_ = puVar7[3];
          }
          else {
            local_300.field_2._M_allocated_capacity = *psVar9;
            local_300._M_dataplus._M_p = (pointer)*puVar7;
          }
          local_300._M_string_length = puVar7[1];
          *puVar7 = psVar9;
          puVar7[1] = 0;
          *(undefined1 *)(puVar7 + 2) = 0;
          puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_300);
          local_2b0.GeneratorName._M_dataplus._M_p = (pointer)&local_2b0.GeneratorName.field_2;
          psVar9 = puVar7 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar7 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar9) {
            local_2b0.GeneratorName.field_2._M_allocated_capacity = *psVar9;
            local_2b0.GeneratorName.field_2._8_8_ = puVar7[3];
          }
          else {
            local_2b0.GeneratorName.field_2._M_allocated_capacity = *psVar9;
            local_2b0.GeneratorName._M_dataplus._M_p = (pointer)*puVar7;
          }
          local_2b0.GeneratorName._M_string_length = puVar7[1];
          *puVar7 = psVar9;
          puVar7[1] = 0;
          *(undefined1 *)(puVar7 + 2) = 0;
          if (errorMessage != (string *)0x0) {
            std::__cxx11::string::_M_assign((string *)errorMessage);
          }
        }
        else {
          local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e0,"\"","");
          puVar7 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_2e0,
                              (ulong)kSOURCE_DIRECTORY_KEY_abi_cxx11_._M_dataplus._M_p);
          local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
          psVar9 = puVar7 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar7 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar9) {
            local_300.field_2._M_allocated_capacity = *psVar9;
            local_300.field_2._8_8_ = puVar7[3];
          }
          else {
            local_300.field_2._M_allocated_capacity = *psVar9;
            local_300._M_dataplus._M_p = (pointer)*puVar7;
          }
          local_300._M_string_length = puVar7[1];
          *puVar7 = psVar9;
          puVar7[1] = 0;
          *(undefined1 *)(puVar7 + 2) = 0;
          puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_300);
          local_2b0.GeneratorName._M_dataplus._M_p = (pointer)&local_2b0.GeneratorName.field_2;
          psVar9 = puVar7 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar7 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar9) {
            local_2b0.GeneratorName.field_2._M_allocated_capacity = *psVar9;
            local_2b0.GeneratorName.field_2._8_8_ = puVar7[3];
          }
          else {
            local_2b0.GeneratorName.field_2._M_allocated_capacity = *psVar9;
            local_2b0.GeneratorName._M_dataplus._M_p = (pointer)*puVar7;
          }
          local_2b0.GeneratorName._M_string_length = puVar7[1];
          *puVar7 = psVar9;
          puVar7[1] = 0;
          *(undefined1 *)(puVar7 + 2) = 0;
          if (errorMessage != (string *)0x0) {
            std::__cxx11::string::_M_assign((string *)errorMessage);
          }
        }
      }
LAB_003a20d2:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0.GeneratorName._M_dataplus._M_p != &local_2b0.GeneratorName.field_2)
      goto LAB_003a1bcb;
      goto LAB_003a1bd8;
    }
    bVar1 = cmsys::SystemTools::FileIsDirectory(&local_190);
    if (!bVar1) {
      local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e0,"\"","");
      puVar7 = (undefined8 *)
               std::__cxx11::string::_M_append
                         ((char *)&local_2e0,(ulong)kBUILD_DIRECTORY_KEY_abi_cxx11_._M_dataplus._M_p
                         );
      local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
      psVar9 = puVar7 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar9) {
        local_300.field_2._M_allocated_capacity = *psVar9;
        local_300.field_2._8_8_ = puVar7[3];
      }
      else {
        local_300.field_2._M_allocated_capacity = *psVar9;
        local_300._M_dataplus._M_p = (pointer)*puVar7;
      }
      local_300._M_string_length = puVar7[1];
      *puVar7 = psVar9;
      puVar7[1] = 0;
      *(undefined1 *)(puVar7 + 2) = 0;
      puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_300);
      local_2b0.GeneratorName._M_dataplus._M_p = (pointer)&local_2b0.GeneratorName.field_2;
      psVar9 = puVar7 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar9) {
        local_2b0.GeneratorName.field_2._M_allocated_capacity = *psVar9;
        local_2b0.GeneratorName.field_2._8_8_ = puVar7[3];
      }
      else {
        local_2b0.GeneratorName.field_2._M_allocated_capacity = *psVar9;
        local_2b0.GeneratorName._M_dataplus._M_p = (pointer)*puVar7;
      }
      local_2b0.GeneratorName._M_string_length = puVar7[1];
      *puVar7 = psVar9;
      puVar7[1] = 0;
      *(undefined1 *)(puVar7 + 2) = 0;
      if (errorMessage != (string *)0x0) {
        std::__cxx11::string::_M_assign((string *)errorMessage);
      }
      goto LAB_003a20d2;
    }
    cmake::FindCacheFile(&local_2b0.GeneratorName,&local_190);
    bVar1 = cmake::LoadCache(this_00,&local_2b0.GeneratorName);
    if (!bVar1) {
LAB_003a18db:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0.GeneratorName._M_dataplus._M_p != &local_2b0.GeneratorName.field_2) {
        operator_delete(local_2b0.GeneratorName._M_dataplus._M_p,
                        local_2b0.GeneratorName.field_2._M_allocated_capacity + 1);
      }
      goto LAB_003a18f7;
    }
    state = this_00->State;
    local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_300,"CMAKE_GENERATOR","");
    paVar13 = &local_2e0.field_2;
    local_2e0._M_dataplus._M_p = (pointer)paVar13;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e0,"generator","");
    bVar1 = getOrTestValue(state,&local_300,&local_1f0,&local_2e0,errorMessage);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e0._M_dataplus._M_p != paVar13) {
      operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_300._M_dataplus._M_p != &local_300.field_2) {
      operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
    }
    if (bVar1) {
      local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_300,"CMAKE_EXTRA_GENERATOR","");
      local_2e0._M_dataplus._M_p = (pointer)paVar13;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e0,"extra generator","");
      bVar1 = getOrTestValue(state,&local_300,&local_d0,&local_2e0,errorMessage);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e0._M_dataplus._M_p != paVar13) {
        operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_300._M_dataplus._M_p != &local_300.field_2) {
        operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
      }
      if ((bVar1) && (bVar1 = getOrTestHomeDirectory(state,&local_170,errorMessage), bVar1)) {
        local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_300,"CMAKE_GENERATOR_TOOLSET","");
        local_2e0._M_dataplus._M_p = (pointer)paVar13;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e0,"toolset","");
        bVar1 = getOrTestValue(state,&local_300,&local_90,&local_2e0,errorMessage);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e0._M_dataplus._M_p != paVar13) {
          operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_300._M_dataplus._M_p != &local_300.field_2) {
          operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
        }
        if (bVar1) {
          local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_300,"CMAKE_GENERATOR_PLATFORM","");
          local_2e0._M_dataplus._M_p = (pointer)paVar13;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e0,"platform","");
          bVar1 = getOrTestValue(state,&local_300,&local_b0,&local_2e0,errorMessage);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2e0._M_dataplus._M_p != paVar13) {
            operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_300._M_dataplus._M_p != &local_300.field_2) {
            operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
          }
          if (bVar1) goto LAB_003a18db;
        }
      }
    }
    uVar10 = local_2b0.GeneratorName.field_2._M_allocated_capacity;
    _Var11._M_p = local_2b0.GeneratorName._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0.GeneratorName._M_dataplus._M_p != &local_2b0.GeneratorName.field_2)
    goto LAB_003a1bfe;
  }
  bVar1 = false;
LAB_003a1c08:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != &local_190.field_2) {
    operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
  }
  return bVar1;
}

Assistant:

bool cmServerProtocol1::DoActivate(const cmServerRequest& request,
                                   std::string* errorMessage)
{
  std::string sourceDirectory = request.Data[kSOURCE_DIRECTORY_KEY].asString();
  std::string buildDirectory = request.Data[kBUILD_DIRECTORY_KEY].asString();
  std::string generator = request.Data[kGENERATOR_KEY].asString();
  std::string extraGenerator = request.Data[kEXTRA_GENERATOR_KEY].asString();
  std::string toolset = request.Data[kTOOLSET_KEY].asString();
  std::string platform = request.Data[kPLATFORM_KEY].asString();

  // normalize source and build directory
  if (!sourceDirectory.empty()) {
    sourceDirectory = cmSystemTools::CollapseFullPath(sourceDirectory);
    cmSystemTools::ConvertToUnixSlashes(sourceDirectory);
  }
  if (!buildDirectory.empty()) {
    buildDirectory = cmSystemTools::CollapseFullPath(buildDirectory);
    cmSystemTools::ConvertToUnixSlashes(buildDirectory);
  }

  if (buildDirectory.empty()) {
    setErrorMessage(errorMessage,
                    std::string("\"") + kBUILD_DIRECTORY_KEY +
                      "\" is missing.");
    return false;
  }

  cmake* cm = CMakeInstance();
  if (cmSystemTools::PathExists(buildDirectory)) {
    if (!cmSystemTools::FileIsDirectory(buildDirectory)) {
      setErrorMessage(errorMessage,
                      std::string("\"") + kBUILD_DIRECTORY_KEY +
                        "\" exists but is not a directory.");
      return false;
    }

    const std::string cachePath = cmake::FindCacheFile(buildDirectory);
    if (cm->LoadCache(cachePath)) {
      cmState* state = cm->GetState();

      // Check generator:
      if (!getOrTestValue(state, "CMAKE_GENERATOR", generator, "generator",
                          errorMessage)) {
        return false;
      }

      // check extra generator:
      if (!getOrTestValue(state, "CMAKE_EXTRA_GENERATOR", extraGenerator,
                          "extra generator", errorMessage)) {
        return false;
      }

      // check sourcedir:
      if (!getOrTestHomeDirectory(state, sourceDirectory, errorMessage)) {
        return false;
      }

      // check toolset:
      if (!getOrTestValue(state, "CMAKE_GENERATOR_TOOLSET", toolset, "toolset",
                          errorMessage)) {
        return false;
      }

      // check platform:
      if (!getOrTestValue(state, "CMAKE_GENERATOR_PLATFORM", platform,
                          "platform", errorMessage)) {
        return false;
      }
    }
  }

  if (sourceDirectory.empty()) {
    setErrorMessage(errorMessage,
                    std::string("\"") + kSOURCE_DIRECTORY_KEY +
                      "\" is unset but required.");
    return false;
  }
  if (!cmSystemTools::FileIsDirectory(sourceDirectory)) {
    setErrorMessage(errorMessage,
                    std::string("\"") + kSOURCE_DIRECTORY_KEY +
                      "\" is not a directory.");
    return false;
  }
  if (generator.empty()) {
    setErrorMessage(errorMessage,
                    std::string("\"") + kGENERATOR_KEY +
                      "\" is unset but required.");
    return false;
  }

  std::vector<cmake::GeneratorInfo> generators;
  cm->GetRegisteredGenerators(generators);
  auto baseIt = std::find_if(generators.begin(), generators.end(),
                             [&generator](const cmake::GeneratorInfo& info) {
                               return info.name == generator;
                             });
  if (baseIt == generators.end()) {
    setErrorMessage(errorMessage,
                    std::string("Generator \"") + generator +
                      "\" not supported.");
    return false;
  }
  auto extraIt = std::find_if(
    generators.begin(), generators.end(),
    [&generator, &extraGenerator](const cmake::GeneratorInfo& info) {
      return info.baseName == generator && info.extraName == extraGenerator;
    });
  if (extraIt == generators.end()) {
    setErrorMessage(errorMessage,
                    std::string("The combination of generator \"" + generator +
                                "\" and extra generator \"" + extraGenerator +
                                "\" is not supported."));
    return false;
  }
  if (!extraIt->supportsToolset && !toolset.empty()) {
    setErrorMessage(errorMessage,
                    std::string("Toolset was provided but is not supported by "
                                "the requested generator."));
    return false;
  }
  if (!extraIt->supportsPlatform && !platform.empty()) {
    setErrorMessage(errorMessage,
                    std::string("Platform was provided but is not supported "
                                "by the requested generator."));
    return false;
  }

  this->GeneratorInfo =
    GeneratorInformation(generator, extraGenerator, toolset, platform,
                         sourceDirectory, buildDirectory);

  this->m_State = STATE_ACTIVE;
  return true;
}